

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::torrent_added_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_added_alert *this)

{
  string local_30;
  
  torrent_alert::message_abi_cxx11_(&local_30,&this->super_torrent_alert);
  std::operator+(__return_storage_ptr__,&local_30," added");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_added_alert::message() const
	{
		return torrent_alert::message() + " added";
	}